

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

shared_ptr<Camera> Camera::Create(shared_ptr<myvk::Device> *device,uint32_t frame_count)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  element_type *peVar1;
  uint in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  DescriptorSet *in_RSI;
  element_type *in_RDI;
  shared_ptr<Camera> sVar3;
  uint32_t i;
  VkDescriptorSetLayoutBinding camera_binding;
  shared_ptr<Camera> *ret;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffe08;
  shared_ptr<myvk::Buffer> *__r;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffe10;
  shared_ptr<myvk::Buffer> *this;
  allocator_type *in_stack_fffffffffffffe18;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
  *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe38;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffe40;
  Ptr<Device> *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  VmaMemoryUsage memory_usage;
  shared_ptr<myvk::DescriptorSetLayout> *psVar4;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *size;
  Ptr<Device> *device_00;
  undefined1 *offset;
  element_type *buffer;
  DescriptorSet *this_00;
  undefined1 local_158 [24];
  undefined8 uStack_140;
  undefined8 local_138;
  shared_ptr<myvk::Buffer> local_128;
  uint local_118;
  allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> local_111 [49];
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  *in_stack_ffffffffffffff20;
  Ptr<DescriptorPool> *local_88;
  allocator<VkDescriptorPoolSize> local_59;
  undefined4 local_58;
  uint local_54;
  undefined4 *local_50;
  undefined8 local_48;
  Ptr<Device> local_28;
  undefined1 local_15;
  uint local_14;
  DescriptorSet *local_10;
  
  local_15 = 0;
  buffer = in_RDI;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::make_shared<Camera>();
  local_58 = 6;
  local_54 = local_14;
  local_50 = &local_58;
  local_48 = 1;
  this_00 = local_10;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x12f493);
  __l._M_len._0_4_ = in_stack_fffffffffffffe50;
  __l._M_array = (iterator)in_stack_fffffffffffffe48;
  __l._M_len._4_4_ = in_stack_fffffffffffffe54;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            (in_stack_fffffffffffffe40,__l,(allocator_type *)in_stack_fffffffffffffe38);
  myvk::DescriptorPool::Create
            (in_stack_fffffffffffffe48,(uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             in_stack_fffffffffffffe38);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f4ea);
  device_00 = &local_28;
  std::shared_ptr<myvk::DescriptorPool>::operator=
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x12f50d);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            (in_stack_fffffffffffffe20);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_59);
  local_88 = (Ptr<DescriptorPool> *)0x600000000;
  offset = &stack0xffffffffffffff27;
  std::allocator<VkDescriptorSetLayoutBinding>::allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)0x12f5c5);
  __l_00._M_len._0_4_ = in_stack_fffffffffffffe50;
  __l_00._M_array = (iterator)in_stack_fffffffffffffe48;
  __l_00._M_len._4_4_ = in_stack_fffffffffffffe54;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_stack_fffffffffffffe40,__l_00,in_stack_fffffffffffffe38);
  myvk::DescriptorSetLayout::Create
            ((Ptr<Device> *)buffer,
             (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_RDI);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f60f);
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffe10,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffe08);
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x12f632);
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::~vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             in_stack_fffffffffffffe20);
  std::allocator<VkDescriptorSetLayoutBinding>::~allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)&stack0xffffffffffffff27);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f656);
  memory_usage = VMA_MEMORY_USAGE_UNKNOWN;
  peVar1 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x12f675);
  psVar4 = &peVar1->m_descriptor_set_layout;
  size = local_111;
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::allocator
            ((allocator<std::shared_ptr<myvk::DescriptorSetLayout>_> *)0x12f690);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
            *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
           (value_type *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  myvk::DescriptorSet::CreateMultiple(local_88,in_stack_ffffffffffffff20);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f6d4);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::operator=((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
               *)in_stack_fffffffffffffe20,
              (vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
               *)in_stack_fffffffffffffe18);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)in_stack_fffffffffffffe20);
  std::
  vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSetLayout>,_std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>_>
             *)in_stack_fffffffffffffe20);
  std::allocator<std::shared_ptr<myvk::DescriptorSetLayout>_>::~allocator(local_111);
  std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12f71b);
  std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
  resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  _Var2._M_pi = extraout_RDX;
  for (local_118 = 0; local_118 < local_14; local_118 = local_118 + 1) {
    local_158._16_8_ = (pointer)0x0;
    uStack_140 = 0;
    local_138 = 0;
    __r = (shared_ptr<myvk::Buffer> *)(local_158 + 0x10);
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
           0x12f787);
    myvk::Buffer::Create
              (device_00,(VkDeviceSize)size,(VmaAllocationCreateFlags)((ulong)psVar4 >> 0x20),
               (VkBufferUsageFlags)psVar4,memory_usage,
               (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                *)in_RDI);
    peVar1 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x12f7c6);
    std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
    operator[](&peVar1->m_uniform_buffers,(ulong)local_118);
    this = &local_128;
    std::shared_ptr<myvk::Buffer>::operator=(this,__r);
    std::shared_ptr<myvk::Buffer>::~shared_ptr((shared_ptr<myvk::Buffer> *)0x12f7fa);
    std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
    ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_> *)
            in_stack_fffffffffffffe20);
    peVar1 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x12f811);
    std::
    vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
    ::operator[](&peVar1->m_descriptor_sets,(ulong)local_118);
    std::__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x12f82e);
    peVar1 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        0x12f83d);
    std::vector<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>::
    operator[](&peVar1->m_uniform_buffers,(ulong)local_118);
    in_stack_fffffffffffffe20 =
         (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)local_158;
    std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
              ((shared_ptr<myvk::BufferBase> *)this,__r);
    myvk::DescriptorSet::UpdateUniformBuffer
              (this_00,(Ptr<BufferBase> *)buffer,(uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
               (VkDeviceSize)offset,(VkDeviceSize)local_10);
    std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x12f893);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>._M_ptr = buffer;
  return (shared_ptr<Camera>)sVar3.super___shared_ptr<Camera,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Camera> Camera::Create(const std::shared_ptr<myvk::Device> &device, uint32_t frame_count) {
	std::shared_ptr<Camera> ret = std::make_shared<Camera>();
	ret->m_descriptor_pool =
	    myvk::DescriptorPool::Create(device, frame_count, {{VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, frame_count}});
	{
		VkDescriptorSetLayoutBinding camera_binding = {};
		camera_binding.binding = 0;
		camera_binding.descriptorType = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
		camera_binding.descriptorCount = 1;
		camera_binding.stageFlags = VK_SHADER_STAGE_COMPUTE_BIT | VK_SHADER_STAGE_FRAGMENT_BIT;

		ret->m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {camera_binding});
	}

	ret->m_descriptor_sets = myvk::DescriptorSet::CreateMultiple(
	    ret->m_descriptor_pool,
	    std::vector<std::shared_ptr<myvk::DescriptorSetLayout>>(frame_count, ret->m_descriptor_set_layout));
	ret->m_uniform_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		ret->m_uniform_buffers[i] = myvk::Buffer::Create(device, sizeof(UniformData),
		                                                 VMA_ALLOCATION_CREATE_MAPPED_BIT |
		                                                     VMA_ALLOCATION_CREATE_HOST_ACCESS_SEQUENTIAL_WRITE_BIT,
		                                                 VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT);
		ret->m_descriptor_sets[i]->UpdateUniformBuffer(ret->m_uniform_buffers[i], 0);
	}

	return ret;
}